

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_ReplaceItemInObject(cJSON *object,char *string,cJSON *newitem)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  cJSON *local_30;
  cJSON *c;
  int i;
  cJSON *newitem_local;
  char *string_local;
  cJSON *object_local;
  
  c._4_4_ = 0;
  local_30 = object->child;
  while( true ) {
    bVar3 = false;
    if (local_30 != (cJSON *)0x0) {
      iVar1 = cJSON_strcasecmp(local_30->string,string);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    c._4_4_ = c._4_4_ + 1;
    local_30 = local_30->next;
  }
  if (local_30 != (cJSON *)0x0) {
    pcVar2 = cJSON_strdup(string);
    newitem->string = pcVar2;
    cJSON_ReplaceItemInArray(object,c._4_4_,newitem);
  }
  return;
}

Assistant:

void   cJSON_ReplaceItemInObject(cJSON *object,const char *string,cJSON *newitem){int i=0;cJSON *c=object->child;while(c && cJSON_strcasecmp(c->string,string))i++,c=c->next;if(c){newitem->string=cJSON_strdup(string);cJSON_ReplaceItemInArray(object,i,newitem);}}